

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_vmmath.c
# Opt level: O0

int32_t lj_vm_modi(int32_t a,int32_t b)

{
  uint local_1c;
  uint local_18;
  uint32_t ub;
  uint32_t ua;
  uint32_t y;
  int32_t b_local;
  int32_t a_local;
  
  local_18 = a;
  if (a < 0) {
    local_18 = (a ^ 0xffffffffU) + 1;
  }
  local_1c = b;
  if (b < 0) {
    local_1c = (b ^ 0xffffffffU) + 1;
  }
  y = local_18 % local_1c;
  if ((y != 0) && ((a ^ b) < 0)) {
    y = y - local_1c;
  }
  if ((int)(y ^ b) < 0) {
    y = (y ^ 0xffffffff) + 1;
  }
  return y;
}

Assistant:

int32_t LJ_FASTCALL lj_vm_modi(int32_t a, int32_t b)
{
  uint32_t y, ua, ub;
  /* This must be checked before using this function. */
  lj_assertX(b != 0, "modulo with zero divisor");
  ua = a < 0 ? ~(uint32_t)a+1u : (uint32_t)a;
  ub = b < 0 ? ~(uint32_t)b+1u : (uint32_t)b;
  y = ua % ub;
  if (y != 0 && (a^b) < 0) y = y - ub;
  if (((int32_t)y^b) < 0) y = ~y+1u;
  return (int32_t)y;
}